

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O2

void alex::fanout_tree::collect_used_nodes
               (vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                *fanout_tree,int max_level,
               vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               *used_fanout_tree_nodes)

{
  pointer pvVar1;
  pointer pFVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  FTNode *tree_node;
  value_type *__x;
  undefined1 local_34 [4];
  
  iVar3 = (int)(((long)(fanout_tree->
                       super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(fanout_tree->
                      super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x18) + -1;
  if (max_level <= iVar3) {
    iVar3 = max_level;
  }
  iVar4 = -1;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  for (uVar5 = 0; uVar5 != iVar4 + 1; uVar5 = uVar5 + 1) {
    pvVar1 = (fanout_tree->
             super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = *(pointer *)
              ((long)&pvVar1[uVar5].
                      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ._M_impl.super__Vector_impl_data + 8);
    for (__x = pvVar1[uVar5].
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != pFVar2; __x = __x + 1) {
      if (__x->use == true) {
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
        push_back(used_fanout_tree_nodes,__x);
      }
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
            ((used_fanout_tree_nodes->
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (used_fanout_tree_nodes->
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_examples____core_alex_fanout_tree_h:51:13)>
              )local_34);
  return;
}

Assistant:

inline void collect_used_nodes(const std::vector<std::vector<FTNode>>& fanout_tree,
                        int max_level,
                        std::vector<FTNode>& used_fanout_tree_nodes) {
  max_level = std::min(max_level, static_cast<int>(fanout_tree.size()) - 1);
  for (int i = 0; i <= max_level; i++) {
    auto& level = fanout_tree[i];
    for (const FTNode& tree_node : level) {
      if (tree_node.use) {
        used_fanout_tree_nodes.push_back(tree_node);
      }
    }
  }
  std::sort(used_fanout_tree_nodes.begin(), used_fanout_tree_nodes.end(),
            [&](FTNode& left, FTNode& right) {
              // this is better than comparing boundary locations
              return (left.node_id << (max_level - left.level)) <
                     (right.node_id << (max_level - right.level));
            });
}